

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void NodeReportError(anynode *AnyNode,node *Sender,fourcc_t Class,int No,...)

{
  long lVar1;
  va_list Args;
  
  if (AnyNode != (anynode *)0x0) {
    lVar1 = **(long **)((long)AnyNode + 8);
    if (*(long *)(lVar1 + 0xc0) != 0) {
      (**(code **)(lVar1 + 0xc0))(lVar1,Sender,_Class,_No);
    }
    return;
  }
  __assert_fail("(const void*)(AnyNode)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                ,0xb01,"void NodeReportError(anynode *, node *, fourcc_t, int, ...)");
}

Assistant:

void NodeReportError(anynode* AnyNode, node* Sender, fourcc_t Class, int No,...)
{
    nodecontext* Context = Node_Context(AnyNode);
    if (Context->ReportError)
    {
        va_list Args;
        va_start(Args,No);
        Context->ReportError(Context,Sender,Class,No,Args);
        va_end(Args);
    }
}